

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O2

void __thiscall wasm::RemoveNonJSOpsPass::rewriteCopysign(RemoveNonJSOpsPass *this,Binary *curr)

{
  Builder *this_00;
  Builder *pBVar1;
  Builder *this_01;
  Unary *pUVar2;
  Const *pCVar3;
  Binary *pBVar4;
  UnaryOp op;
  Literal local_d8;
  Literal local_c0;
  Binary *local_a8;
  Binary *local_a0;
  undefined1 auStack_98 [8];
  Literal signBit;
  undefined1 auStack_78 [8];
  Literal otherBits;
  anon_union_16_6_1532cd5a_for_Literal_0 local_58;
  undefined8 local_48;
  BinaryOp local_3c;
  UnaryOp local_38;
  BinaryOp local_34;
  
  signBit.field_0.func.super_IString.str._M_str = (char *)0x0;
  otherBits.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_98 = (undefined1  [8])0x0;
  signBit.field_0.i64 = 0;
  auStack_78 = (undefined1  [8])0x0;
  otherBits.field_0.i64 = 0;
  if (curr->op == CopySignFloat64) {
    local_58.i64 = -0x8000000000000000;
    local_48 = 3;
    Literal::operator=((Literal *)auStack_98,(Literal *)&local_58.func);
    Literal::~Literal((Literal *)&local_58.func);
    local_58.i64 = 0x7fffffffffffffff;
    local_48 = 3;
    Literal::operator=((Literal *)auStack_78,(Literal *)&local_58.func);
    Literal::~Literal((Literal *)&local_58.func);
    local_3c = OrInt64;
    local_34 = AndInt64;
    op = ReinterpretFloat64;
    local_38 = ReinterpretInt64;
  }
  else {
    if (curr->op != CopySignFloat32) goto LAB_00b51d40;
    local_58.i32 = -0x80000000;
    local_48 = 2;
    Literal::operator=((Literal *)auStack_98,(Literal *)&local_58.func);
    Literal::~Literal((Literal *)&local_58.func);
    local_58.i32 = 0x7fffffff;
    local_48 = 2;
    Literal::operator=((Literal *)auStack_78,(Literal *)&local_58.func);
    Literal::~Literal((Literal *)&local_58.func);
    local_3c = OrInt32;
    local_34 = AndInt32;
    op = ReinterpretFloat32;
    local_38 = ReinterpretInt32;
  }
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_a8 = curr;
  pUVar2 = Builder::makeUnary(this_00,op,curr->left);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal(&local_d8,(Literal *)auStack_78);
  pCVar3 = Builder::makeConst(pBVar1,&local_d8);
  local_a0 = Builder::makeBinary(this_00,local_34,(Expression *)pUVar2,(Expression *)pCVar3);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pUVar2 = Builder::makeUnary(pBVar1,op,local_a8->right);
  this_01 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal(&local_c0,(Literal *)auStack_98);
  pCVar3 = Builder::makeConst(this_01,&local_c0);
  pBVar4 = Builder::makeBinary(pBVar1,local_34,(Expression *)pUVar2,(Expression *)pCVar3);
  pBVar4 = Builder::makeBinary(this_00,local_3c,(Expression *)local_a0,(Expression *)pBVar4);
  pUVar2 = Builder::makeUnary(this_00,local_38,(Expression *)pBVar4);
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,(Expression *)pUVar2);
  Literal::~Literal(&local_c0);
  Literal::~Literal(&local_d8);
LAB_00b51d40:
  Literal::~Literal((Literal *)auStack_78);
  Literal::~Literal((Literal *)auStack_98);
  return;
}

Assistant:

void rewriteCopysign(Binary* curr) {

    // i32.copysign(x, y)   =>   f32.reinterpret(
    //   (i32.reinterpret(x) & ~(1 << 31)) |
    //   (i32.reinterpret(y) &  (1 << 31)
    // )
    //
    // i64.copysign(x, y)   =>   f64.reinterpret(
    //   (i64.reinterpret(x) & ~(1 << 63)) |
    //   (i64.reinterpret(y) &  (1 << 63)
    // )

    Literal signBit, otherBits;
    UnaryOp int2float, float2int;
    BinaryOp bitAnd, bitOr;

    switch (curr->op) {
      case CopySignFloat32:
        float2int = ReinterpretFloat32;
        int2float = ReinterpretInt32;
        bitAnd = AndInt32;
        bitOr = OrInt32;
        signBit = Literal(uint32_t(1U << 31));
        otherBits = Literal(~uint32_t(1U << 31));
        break;

      case CopySignFloat64:
        float2int = ReinterpretFloat64;
        int2float = ReinterpretInt64;
        bitAnd = AndInt64;
        bitOr = OrInt64;
        signBit = Literal(uint64_t(1ULL << 63));
        otherBits = Literal(~uint64_t(1ULL << 63));
        break;

      default:
        return;
    }

    replaceCurrent(builder->makeUnary(
      int2float,
      builder->makeBinary(
        bitOr,
        builder->makeBinary(bitAnd,
                            builder->makeUnary(float2int, curr->left),
                            builder->makeConst(otherBits)),
        builder->makeBinary(bitAnd,
                            builder->makeUnary(float2int, curr->right),
                            builder->makeConst(signBit)))));
  }